

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

void __thiscall
tf::Node::Node<std::in_place_type_t<tf::Node::Static>,bit_state(unsigned_int)::__0>
          (Node *this,nstate_t nstate,estate_t estate,DefaultTaskParams *param_4,Topology *topology,
          Node *parent,size_t join_counter,in_place_type_t<tf::Node::Static> *args,
          anon_class_1_0_00000001 *args_1)

{
  undefined4 in_ESI;
  undefined4 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000018;
  undefined4 in_stack_ffffffffffffffa8;
  __integral_type in_stack_ffffffffffffffac;
  atomic<int> *in_stack_ffffffffffffffb0;
  string *this_00;
  
  *in_RDI = in_ESI;
  std::atomic<int>::atomic(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  this_00 = (string *)(in_RDI + 2);
  std::__cxx11::string::string(this_00);
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 0xc) = in_R8;
  *(undefined8 *)(in_RDI + 0xe) = in_R9;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  SmallVector<tf::Node_*,_4U>::SmallVector((SmallVector<tf::Node_*,_4U> *)0x1472d4);
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)this_00,
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  std::
  variant<std::monostate,tf::Node::Static,tf::Node::Runtime,tf::Node::Subflow,tf::Node::Condition,tf::Node::MultiCondition,tf::Node::Module,tf::Node::Async,tf::Node::DependentAsync>
  ::variant<tf::Node::Static,bit_state(unsigned_int)::__0,void>
            ((variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              *)(in_RDI + 0x22),in_stack_00000018);
  std::unique_ptr<tf::Node::Semaphores,std::default_delete<tf::Node::Semaphores>>::
  unique_ptr<std::default_delete<tf::Node::Semaphores>,void>
            ((unique_ptr<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_> *)this_00
            );
  std::__exception_ptr::exception_ptr::exception_ptr
            ((exception_ptr *)(in_RDI + 0x34),(nullptr_t)0x0);
  return;
}

Assistant:

Node::Node(
  nstate_t nstate,
  estate_t estate,
  const DefaultTaskParams&,
  Topology* topology, 
  Node* parent, 
  size_t join_counter,
  Args&&... args
) :
  _nstate       {nstate},
  _estate       {estate},
  _topology     {topology},
  _parent       {parent},
  _join_counter {join_counter},
  _handle       {std::forward<Args>(args)...} {
}